

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

void readNumArrHelper<std::vector<long_long,std::allocator<long_long>>,long_long>
               (IniProcessing *self,char *key,vector<long_long,_std::allocator<long_long>_> *dest,
               vector<long_long,_std::allocator<long_long>_> *defVal)

{
  iterator iVar1;
  bool ok;
  bool local_21;
  value_type_conflict6 local_20;
  
  local_21 = false;
  iVar1 = IniProcessing_readHelper_abi_cxx11_(self,key,&local_21);
  if (local_21 != false) {
    local_20 = 0;
    StrToNumVectorHelper<std::vector<long_long,std::allocator<long_long>>>
              ((string *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x28),dest,&local_20);
    return;
  }
  std::vector<long_long,_std::allocator<long_long>_>::operator=(dest,defVal);
  return;
}

Assistant:

void readNumArrHelper(IniProcessing *self, const char *key, TList &dest, const TList &defVal)
{
    bool ok = false;
    IniProcessing::params::IniKeys::iterator e = IniProcessing_readHelper(self, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    StrToNumVectorHelper(e->second, dest, static_cast<T>(0));
}